

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O2

SC_Timing * Scl_CellPinTime(SC_Cell *pCell,int iPin)

{
  void *pvVar1;
  SC_Timing *pSVar2;
  
  if ((iPin < 0) || (pCell->n_inputs <= iPin)) {
    __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                  ,0x28e,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
  }
  pvVar1 = Vec_PtrEntry(&pCell->vPins,pCell->n_inputs);
  if (*(int *)((long)pvVar1 + 0x44) != pCell->n_inputs) {
    __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                  ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
  }
  pvVar1 = Vec_PtrEntry((Vec_Ptr_t *)((long)pvVar1 + 0x40),iPin);
  if (*(int *)((long)pvVar1 + 0xc) != 0) {
    if (*(int *)((long)pvVar1 + 0xc) == 1) {
      pSVar2 = (SC_Timing *)Vec_PtrEntry((Vec_Ptr_t *)((long)pvVar1 + 8),0);
      return pSVar2;
    }
    __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                  ,0x294,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
  }
  return (SC_Timing *)0x0;
}

Assistant:

static inline SC_Timing * Scl_CellPinTime( SC_Cell * pCell, int iPin )
{
    SC_Pin * pPin;
    SC_Timings * pRTime;
    assert( iPin >= 0 && iPin < pCell->n_inputs );
    pPin = SC_CellPin( pCell, pCell->n_inputs );
    assert( Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs );
    pRTime = (SC_Timings *)Vec_PtrEntry( &pPin->vRTimings, iPin );
    if ( Vec_PtrSize(&pRTime->vTimings) == 0 )
        return NULL;
    assert( Vec_PtrSize(&pRTime->vTimings) == 1 );
    return (SC_Timing *)Vec_PtrEntry( &pRTime->vTimings, 0 );
}